

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O0

bool __thiscall
lzham::vector<lzham::symbol_codec::output_symbol>::try_push_back
          (vector<lzham::symbol_codec::output_symbol> *this,output_symbol *obj)

{
  bool bVar1;
  vector<lzham::symbol_codec::output_symbol> *in_RDI;
  undefined2 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffda;
  undefined1 in_stack_ffffffffffffffdb;
  uint in_stack_ffffffffffffffdc;
  bool local_1;
  
  if ((in_RDI->m_size < in_RDI->m_capacity) ||
     (bVar1 = increase_capacity(in_RDI,in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb,
                                (bool)in_stack_ffffffffffffffda), bVar1)) {
    scalar_type<lzham::symbol_codec::output_symbol>::construct
              ((output_symbol *)in_RDI,
               (output_symbol *)
               CONCAT44(in_stack_ffffffffffffffdc,
                        CONCAT13(in_stack_ffffffffffffffdb,
                                 CONCAT12(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8))));
    in_RDI->m_size = in_RDI->m_size + 1;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool try_push_back(const T& obj)
      {
         LZHAM_ASSERT(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
         {
            if (!increase_capacity(m_size + 1, true, true))
               return false;
         }

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;

         return true;
      }